

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneGenericNameMatchInfo::getTimeZoneID
          (TimeZoneGenericNameMatchInfo *this,int32_t index,UnicodeString *tzID)

{
  long *plVar1;
  ConstChar16Ptr local_20 [3];
  
  plVar1 = (long *)UVector::elementAt(this->fMatches,index);
  if ((plVar1 == (long *)0x0) ||
     (local_20[0].p_ = *(char16_t **)(*plVar1 + 8), local_20[0].p_ == (char16_t *)0x0)) {
    icu_63::UnicodeString::setToBogus(tzID);
  }
  else {
    icu_63::UnicodeString::setTo(tzID,'\x01',local_20,-1);
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneGenericNameMatchInfo::getTimeZoneID(int32_t index, UnicodeString& tzID) const {
    GMatchInfo *minfo = (GMatchInfo *)fMatches->elementAt(index);
    if (minfo != NULL && minfo->gnameInfo->tzID != NULL) {
        tzID.setTo(TRUE, minfo->gnameInfo->tzID, -1);
    } else {
        tzID.setToBogus();
    }
    return tzID;
}